

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_customObjectParameterFailsWhenNotHavingAComparisonRepository_Test::
testBody(TEST_MockComparatorCopierTest_customObjectParameterFailsWhenNotHavingAComparisonRepository_Test
         *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *test;
  SimpleString local_130;
  undefined1 local_120 [8];
  MockNoWayToCompareCustomTypeFailure expectedFailure;
  SimpleString local_a8;
  SimpleString local_98;
  SimpleString local_88;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  undefined1 local_28 [8];
  MyTypeForTesting object;
  MockFailureReporterInstaller failureReporterInstaller;
  TEST_MockComparatorCopierTest_customObjectParameterFailsWhenNotHavingAComparisonRepository_Test
  *this_local;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)((long)&object.value + 7));
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)local_28,1);
  SimpleString::SimpleString(local_48,"");
  pMVar2 = mock(local_48,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_58,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_58);
  SimpleString::SimpleString(&local_68,"MyTypeForTesting");
  SimpleString::SimpleString(&local_78,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
            ((long *)CONCAT44(extraout_var,iVar1),&local_68,&local_78,local_28);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString(&local_68);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(local_48);
  SimpleString::SimpleString(&local_88,"");
  pMVar2 = mock(&local_88,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_98,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_98);
  SimpleString::SimpleString(&local_a8,"MyTypeForTesting");
  SimpleString::SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,
             "parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x20))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_a8,
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,local_28);
  SimpleString::~SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString(&local_98);
  SimpleString::~SimpleString(&local_88);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_130,"MyTypeForTesting");
  MockNoWayToCompareCustomTypeFailure::MockNoWayToCompareCustomTypeFailure
            ((MockNoWayToCompareCustomTypeFailure *)local_120,test,&local_130);
  SimpleString::~SimpleString(&local_130);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_120,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
             ,0x5b);
  MockNoWayToCompareCustomTypeFailure::~MockNoWayToCompareCustomTypeFailure
            ((MockNoWayToCompareCustomTypeFailure *)local_120);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)local_28);
  MockFailureReporterInstaller::~MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)((long)&object.value + 7));
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customObjectParameterFailsWhenNotHavingAComparisonRepository)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting object(1);
    mock().expectOneCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);
    mock().actualCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);

    MockNoWayToCompareCustomTypeFailure expectedFailure(mockFailureTest(), "MyTypeForTesting");
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}